

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O2

void design_artifact(artifact_set_data *data,wchar_t tv,int *aidx)

{
  bitflag *flags1;
  _Bool **dest;
  bitflag *pbVar1;
  wchar_t wVar2;
  uint uVar3;
  activation *paVar4;
  slay_conflict *psVar5;
  brand_conflict *pbVar6;
  _Bool _Var7;
  int16_t iVar8;
  uint uVar9;
  wchar_t wVar10;
  int iVar11;
  uint32_t uVar12;
  int iVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  int iVar16;
  object_kind *poVar17;
  artifact *a_dst;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  int *piVar21;
  object_kind *poVar22;
  wchar_t *pwVar23;
  _Bool verbose;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar24;
  _Bool verbose_00;
  uint uVar25;
  wchar_t extraout_EDX;
  long lVar26;
  size_t i;
  int iVar27;
  int iVar28;
  int16_t *piVar29;
  artifact *a;
  artifact *paVar30;
  wchar_t wVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  byte bVar35;
  random_value v;
  long lStackY_3b0;
  uint local_384;
  int local_35c;
  int local_328 [96];
  wchar_t art_freq [94];
  
  paVar30 = a_info;
  bVar35 = 0;
  iVar11 = *aidx;
  poVar17 = lookup_kind(a_info[iVar11].tval,a_info[iVar11].sval);
  local_35c = paVar30[iVar11].level;
  if (tv == L'\0') {
    tv = get_base_item_tval(data);
  }
  paVar30 = paVar30 + iVar11;
  a_dst = (artifact *)mem_zalloc(0x140);
  a = (artifact *)(ulong)(uint)data->avg_tv_power[tv];
  uVar9 = Rand_sample(data->avg_tv_power[tv],data->max_tv_power[tv],data->min_tv_power[tv],0x14,0x14
                     );
  pcVar18 = artifact_gen_name(a,name_sections);
  while ((pcVar19 = strstr(paVar30->name,"The One Ring"), pcVar19 != (char *)0x0 ||
         (_Var7 = flag_has_dbg(poVar17->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART"), _Var7)))
  {
    lVar20 = (long)*aidx + 1;
    *aidx = (int)lVar20;
    if ((int)(uint)z_info->a_max <= (int)lVar20) {
      string_free(pcVar18);
      mem_free(a_dst);
      return;
    }
    paVar30 = a_info + lVar20;
    local_35c = a_info[lVar20].level;
  }
  string_free(paVar30->name);
  paVar30->name = pcVar18;
  file_putf(log_file,">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
  file_putf(log_file,"Artifact %d: power = %d\n",(ulong)(uint)*aidx,uVar9);
  uVar3 = -uVar9;
  if (0 < (int)uVar9) {
    uVar3 = uVar9;
  }
  flags1 = paVar30->flags;
  dest = &paVar30->brands;
  wVar10 = (uVar3 * 6) / 10 + L'\x01';
  if (wVar10 <= uVar3 + L'\xffffffec') {
    wVar10 = uVar3 + L'\xffffffec';
  }
  for (iVar11 = 0; iVar11 != 200; iVar11 = iVar11 + 1) {
    if (tv == L'\0') {
      tv = get_base_item_tval(data);
    }
    local_328[0x18] = 0;
    local_328[0x19] = 0;
    local_328[0x1a] = 0;
    local_328[0x1b] = 0;
    local_328[0x14] = 0;
    local_328[0x15] = 0;
    local_328[0x16] = 0;
    local_328[0x17] = 0;
    local_328[0x10] = 0;
    local_328[0x11] = 0;
    local_328[0x12] = 0;
    local_328[0x13] = 0;
    local_328[0xc] = 0;
    local_328[0xd] = 0;
    local_328[0xe] = 0;
    local_328[0xf] = 0;
    local_328[8] = 0;
    local_328[9] = 0;
    local_328[10] = 0;
    local_328[0xb] = 0;
    local_328[4] = 0;
    local_328[5] = 0;
    local_328[6] = 0;
    local_328[7] = 0;
    local_328[0] = 0;
    local_328[1] = 0;
    local_328[2] = 0;
    local_328[3] = 0;
    local_328[0x1c] = 0;
    local_328[0x1d] = 0;
    wVar31 = L'\x01';
    if ((tv & 0xfffffffeU) == 0x14) {
      wVar31 = L'\0';
      do {
        wVar31 = wVar31 + L'\x01';
        poVar17 = lookup_kind(tv,wVar31);
      } while (poVar17->kidx < (uint)z_info->ordinary_kind_max);
    }
LAB_0018f870:
    poVar17 = (object_kind *)0x0;
LAB_0018f872:
    if (poVar17 == (object_kind *)0x0) goto code_r0x0018f877;
    object_short_name((char *)local_328,0x78,poVar17->name);
    file_putf(log_file,"Creating %s\n",local_328);
    iVar13 = poVar17->sval;
    paVar30->tval = poVar17->tval;
    paVar30->sval = iVar13;
    iVar13 = randcalc(poVar17->to_h,0,MINIMISE);
    paVar30->to_h = iVar13;
    iVar13 = randcalc(poVar17->to_d,0,MINIMISE);
    paVar30->to_d = iVar13;
    iVar13 = randcalc(poVar17->to_a,0,MINIMISE);
    paVar30->to_a = iVar13;
    iVar13 = poVar17->dd;
    iVar16 = poVar17->ds;
    iVar27 = poVar17->weight;
    paVar30->ac = poVar17->ac;
    paVar30->dd = iVar13;
    paVar30->ds = iVar16;
    paVar30->weight = iVar27;
    flag_copy(flags1,poVar17->flags,5);
    mem_free(paVar30->slays);
    paVar30->slays = (_Bool *)0x0;
    copy_slays(&paVar30->slays,poVar17->slays);
    mem_free(paVar30->brands);
    paVar30->brands = (_Bool *)0x0;
    copy_brands(dest,poVar17->brands);
    mem_free(paVar30->curses);
    paVar30->curses = (int *)0x0;
    if (poVar17->curses != (int *)0x0) {
      piVar21 = (int *)mem_alloc((ulong)z_info->curse_max << 2);
      paVar30->curses = piVar21;
      memcpy(piVar21,poVar17->curses,(ulong)z_info->curse_max << 2);
    }
    paVar30->activation = (activation *)0x0;
    string_free(paVar30->alt_msg);
    paVar30->alt_msg = (char *)0x0;
    if (poVar17->activation == (activation *)0x0) {
      if (poVar17->effect == (effect *)0x0) {
        wVar31 = L'\0';
      }
      else {
        wVar31 = poVar17->level;
      }
    }
    else {
      wVar31 = poVar17->activation->level;
    }
    paVar30->level = wVar31;
    (paVar30->time).base = 0;
    (paVar30->time).dice = 0;
    (paVar30->time).sides = 0;
    (paVar30->time).m_bonus = 0;
    for (lVar20 = 0; lVar20 != 0x40; lVar20 = lVar20 + 4) {
      v._8_8_ = *(undefined8 *)(&poVar17->modifiers[0].sides + lVar20);
      v._0_8_ = *(undefined8 *)(&poVar17->modifiers[0].base + lVar20);
      iVar13 = randcalc(v,0,MINIMISE);
      *(int *)((long)paVar30->modifiers + lVar20) = iVar13;
    }
    for (lVar20 = 0; lVar20 != 0x19; lVar20 = lVar20 + 1) {
      paVar30->el_info[lVar20] = poVar17->el_info[lVar20];
    }
    for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
      pbVar1 = &paVar30->el_info[lVar20].flags;
      *pbVar1 = *pbVar1 | 2;
    }
    iVar13 = poVar17->tval;
    if (iVar13 - 10U < 9) {
      uVar12 = data->ac_startval;
      uVar14 = Rand_div(uVar12);
      paVar30->to_a = (int)(short)((short)uVar14 + (short)((int)uVar12 / 2)) + paVar30->to_a;
      file_putf(log_file,"Assigned basic stats, AC bonus: %d\n");
    }
    else if (iVar13 - 5U < 5) {
      uVar12 = data->hit_startval;
      uVar14 = Rand_div(uVar12);
      paVar30->to_h = paVar30->to_h + (int)(short)((short)uVar14 + (short)((int)uVar12 / 2));
      uVar12 = data->dam_startval;
      uVar14 = Rand_div(uVar12);
      paVar30->to_d = (int)(short)((short)uVar14 + (short)((int)uVar12 / 2)) + paVar30->to_d;
      file_putf(log_file,"Assigned basic stats, to_hit: %d, to_dam: %d\n",(ulong)(uint)paVar30->to_h
               );
    }
    else if (iVar13 == 0x13) {
      flag_off(flags1,5,0x14);
      flag_off(flags1,5,0x13);
      flag_on_dbg(flags1,5,0x15,"art->flags","OF_NO_FUEL");
      if ((uint)z_info->ordinary_kind_max <= poVar17->kidx) {
        paVar30->modifiers[0xd] = 3;
      }
    }
    poVar17 = lookup_kind(paVar30->tval,paVar30->sval);
    wVar31 = artifact_power(*aidx,"for base item power",verbose);
    file_putf(log_file,"Base item power %d\n",(ulong)(uint)wVar31);
    if (wVar31 <= wVar10) goto LAB_0018fc55;
    file_putf(log_file,"Power too high!\n");
  }
  file_putf(log_file,"Warning! Couldn\'t get appropriate power level on base item.\n");
LAB_0018fc55:
  for (lVar20 = 0; lVar20 != 0x5e; lVar20 = lVar20 + 1) {
    local_328[lVar20] = 0;
    art_freq[lVar20] = L'\0';
  }
  uVar25 = paVar30->tval;
  piVar21 = data->art_probs;
  if (uVar25 == 5) {
    for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 2) {
      local_328[*(short *)((long)art_idx_bow + lVar20)] =
           piVar21[*(short *)((long)art_idx_bow + lVar20)];
    }
  }
  if (uVar25 - 5 < 5) {
    for (lVar20 = 0; lVar20 != 6; lVar20 = lVar20 + 2) {
      local_328[*(short *)((long)art_idx_weapon + lVar20)] =
           piVar21[*(short *)((long)art_idx_weapon + lVar20)];
    }
  }
  else {
    for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 2) {
      local_328[*(short *)((long)art_idx_nonweapon + lVar20)] =
           piVar21[*(short *)((long)art_idx_nonweapon + lVar20)];
    }
  }
  if (uVar25 - 6 < 4) {
    for (lVar20 = 0; lVar20 != 0x12; lVar20 = lVar20 + 2) {
      local_328[*(short *)((long)art_idx_melee + lVar20)] =
           piVar21[*(short *)((long)art_idx_melee + lVar20)];
    }
  }
  if (uVar25 - 10 < 9) {
    local_328[0x16] = piVar21[0x16];
    if (uVar25 == 10) {
      for (lVar20 = 0; lVar20 != 0xc; lVar20 = lVar20 + 2) {
        local_328[*(short *)((long)art_idx_boot + lVar20)] =
             piVar21[*(short *)((long)art_idx_boot + lVar20)];
      }
    }
    else if (uVar25 == 0xb) {
      for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 2) {
        local_328[*(short *)((long)art_idx_glove + lVar20)] =
             piVar21[*(short *)((long)art_idx_glove + lVar20)];
      }
    }
    if ((uVar25 & 0x1e) == 0xc) {
      for (lVar20 = 0; lVar20 != 0xc; lVar20 = lVar20 + 2) {
        local_328[*(short *)((long)art_idx_headgear + lVar20)] =
             piVar21[*(short *)((long)art_idx_headgear + lVar20)];
      }
    }
    if (uVar25 == 0xe) {
      lVar20 = 0xa0;
      lVar26 = 0x9c;
    }
    else {
      if (uVar25 != 0xf) {
        if (uVar25 - 0x10 < 3) {
          for (lVar20 = 0; lVar20 != 0xe; lVar20 = lVar20 + 2) {
            local_328[*(short *)((long)art_idx_armor + lVar20)] =
                 piVar21[*(short *)((long)art_idx_armor + lVar20)];
          }
        }
        goto LAB_0018fe00;
      }
      lVar20 = 0xa8;
      lVar26 = 0xa4;
    }
    *(undefined4 *)((long)local_328 + lVar26) = *(undefined4 *)((long)piVar21 + lVar26);
    *(undefined4 *)((long)local_328 + lVar20) = *(undefined4 *)((long)piVar21 + lVar20);
  }
LAB_0018fe00:
  for (lVar20 = 0; lVar20 != 0x46; lVar20 = lVar20 + 2) {
    local_328[*(short *)((long)art_idx_gen + lVar20)] =
         piVar21[*(short *)((long)art_idx_gen + lVar20)];
  }
  for (lVar20 = 0; lVar26 = lVar20, lVar20 != 0x5e; lVar20 = lVar20 + 1) {
    for (; lVar26 != 0x5e; lVar26 = lVar26 + 1) {
      art_freq[lVar26] = art_freq[lVar26] + local_328[lVar20];
    }
  }
  for (uVar32 = 0; uVar32 != 0x5e; uVar32 = uVar32 + 1) {
    file_putf(log_file,"Cumulative frequency of ability %d is: %d\n",uVar32 & 0xffffffff,
              (ulong)(uint)art_freq[uVar32]);
  }
  copy_artifact(paVar30,a_dst);
  iVar11 = paVar30->tval;
  if (iVar11 - 6U < 4) {
    uVar12 = Rand_div((uint)z_info->a_max);
    if ((int)uVar12 < data->art_probs[0x57]) {
      uVar12 = Rand_div(4);
      uVar25 = uVar12 + paVar30->dd + 3;
      uVar32 = (ulong)uVar25;
      paVar30->dd = uVar25;
      pcVar18 = "Supercharging damage dice!  (Now %d dice)\n";
LAB_0018ff17:
      file_putf(log_file,pcVar18,uVar32);
    }
    else {
      uVar12 = Rand_div((uint)z_info->a_max);
      if ((int)uVar12 < data->art_probs[0x5b]) {
        paVar30->modifiers[10] = 2;
        pcVar18 = "Supercharging melee blows! (%+d blows)\n";
        uVar32 = 2;
        goto LAB_0018ff17;
      }
    }
    iVar11 = paVar30->tval;
  }
  if (iVar11 == 5) {
    uVar12 = Rand_div((uint)z_info->a_max);
    if ((int)uVar12 < data->art_probs[0x58]) {
      paVar30->modifiers[0xb] = 0x14;
      pcVar18 = "Supercharging shots! (%+d extra shots)\n";
      lStackY_3b0 = 0x14;
    }
    else {
      uVar12 = Rand_div((uint)z_info->a_max);
      if (data->art_probs[0x59] <= (int)uVar12) goto LAB_0018ff94;
      paVar30->modifiers[0xc] = 3;
      pcVar18 = "Supercharging might! (%+d extra might)\n";
      lStackY_3b0 = 3;
    }
    file_putf(log_file,pcVar18,lStackY_3b0);
  }
LAB_0018ff94:
  uVar12 = Rand_div((uint)z_info->a_max);
  if ((int)uVar12 < data->art_probs[0x5a]) {
LAB_0018ffac:
    uVar12 = Rand_div(6);
    paVar30->modifiers[9] = uVar12 + 5;
    uVar12 = Rand_div(2);
    if (uVar12 == 0) {
      uVar12 = Rand_div(3);
      paVar30->modifiers[9] = uVar12 + paVar30->modifiers[9] + 1;
    }
    uVar12 = Rand_div(6);
    if (uVar12 == 0) {
      uVar12 = Rand_div(6);
      uVar25 = uVar12 + paVar30->modifiers[9] + 2;
      paVar30->modifiers[9] = uVar25;
    }
    else {
      uVar25 = paVar30->modifiers[9];
    }
    file_putf(log_file,"Supercharging speed for this item!  (New speed bonus is %d)\n",(ulong)uVar25
             );
LAB_00190038:
    iVar11 = paVar30->tval;
  }
  else {
    iVar11 = paVar30->tval;
    if (iVar11 == 10) {
      uVar12 = Rand_div((uint)z_info->a_max);
      if ((int)uVar12 < data->art_probs[0x1b]) goto LAB_0018ffac;
      goto LAB_00190038;
    }
  }
  if (iVar11 - 6U < 4) {
    uVar12 = Rand_div((uint)z_info->a_max);
    if ((int)uVar12 < data->art_probs[0x5c]) {
LAB_00190060:
      uVar12 = Rand_div(0xb);
      paVar30->to_a = uVar12 + paVar30->to_a + 0x14;
      uVar12 = Rand_div(2);
      if (uVar12 == 0) {
        uVar12 = Rand_div(10);
        paVar30->to_a = uVar12 + paVar30->to_a + 1;
      }
      uVar12 = Rand_div(6);
      if (uVar12 == 0) {
        uVar12 = Rand_div(0x14);
        uVar25 = uVar12 + paVar30->to_a + 1;
        paVar30->to_a = uVar25;
      }
      else {
        uVar25 = paVar30->to_a;
      }
      file_putf(log_file,"Supercharging AC! New AC bonus is %d\n",(ulong)uVar25);
    }
  }
  else if ((iVar11 != 5) &&
          (uVar12 = Rand_div((uint)z_info->a_max), (int)uVar12 < data->art_probs[0x5d]))
  goto LAB_00190060;
  iVar11 = paVar30->tval;
  uVar12 = Rand_div((uint)z_info->a_max);
  uVar24 = extraout_DL;
  if (iVar11 - 5U < 5) {
    if (300 < uVar3) {
      iVar11 = data->art_probs[0x55];
joined_r0x00190167:
      if ((int)uVar12 < iVar11) {
        flag_on_dbg(flags1,5,0x1a,"art->flags","OF_AGGRAVATE");
        file_putf(log_file,"Adding aggravation\n");
        uVar24 = extraout_DL_00;
      }
    }
  }
  else if (300 < uVar3) {
    iVar11 = data->art_probs[0x56];
    goto joined_r0x00190167;
  }
  wVar31 = artifact_power(*aidx,"result of supercharge",(_Bool)uVar24);
  wVar10 = (uVar3 * 0x17) / 0x14 + L'\x01';
  if (wVar10 < wVar31) {
    copy_artifact(a_dst,paVar30);
    file_putf(log_file,"--- Supercharge is too powerful! Rolling back.\n");
  }
  uVar32 = (ulong)(uint)data->neg_power_total;
  if (data->neg_power_total < 3) {
    uVar32 = 2;
  }
  uVar12 = Rand_div((uint32_t)(z_info->a_max / uVar32));
  bVar33 = uVar12 == 0 || (int)uVar9 < 0;
  iVar11 = 0;
  do {
    if (iVar11 == 200) {
      file_putf(log_file,"Warning!  Couldn\'t get appropriate power level on artifact.\n");
      goto LAB_00190d0a;
    }
    copy_artifact(paVar30,a_dst);
    wVar31 = Rand_div(art_freq[0x5d]);
    uVar32 = 0xffffffffffffffff;
    pwVar23 = art_freq;
    do {
      uVar32 = (ulong)((int)uVar32 + 1);
      wVar2 = *pwVar23;
      pwVar23 = pwVar23 + 1;
    } while (wVar2 <= wVar31);
    file_putf(log_file,"Ability chosen was number: %d\n",uVar32);
    poVar22 = lookup_kind(paVar30->tval,paVar30->sval);
    wVar31 = L'\x00258ea0';
    switch(uVar32) {
    case 0:
    case 0xc:
      wVar31 = L'\v';
      break;
    case 1:
      wVar31 = L'\f';
      break;
    case 2:
    case 9:
    case 0xe:
      if ((*dest != (_Bool *)0x0) && (uVar12 = Rand_div(4), uVar12 != 0))
      goto switchD_001902c6_default;
      iVar13 = 0xc9;
      do {
        iVar13 = iVar13 + -1;
        if (iVar13 == 0) goto switchD_001902c6_default;
        uVar12 = Rand_div(z_info->brand_max - 1);
        wVar31 = uVar12 + L'\x01';
        _Var7 = append_brand(dest,wVar31);
        pbVar6 = brands;
      } while (!_Var7);
      file_putf(log_file,"Adding brand: %sx%d\n",brands[wVar31].name,
                (ulong)(uint)brands[wVar31].multiplier);
      uVar12 = Rand_div(4);
      if (uVar12 != 0) {
        lVar20 = 2;
        for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
          iVar13 = strcmp(pbVar6[wVar31].name,*(char **)(&projections->index + lVar20));
          if ((iVar13 == 0) && (paVar30->el_info[lVar26].res_level < 1)) {
            add_resist(paVar30,(wchar_t)lVar26);
          }
          lVar20 = lVar20 + 0x1a;
        }
      }
      goto switchD_001902c6_default;
    case 3:
    case 10:
    case 0xf:
      iVar13 = 0;
      do {
        do {
          if (iVar13 == 200) goto switchD_001902c6_default;
          uVar12 = Rand_div(z_info->slay_max - 1);
          wVar31 = uVar12 + L'\x01';
          _Var7 = append_slay(&paVar30->slays,wVar31);
          psVar5 = slays;
          iVar13 = iVar13 + 1;
        } while (!_Var7);
        iVar13 = 0;
        file_putf(log_file,"Adding slay: %sx%d\n",slays[wVar31].name,
                  (ulong)(uint)slays[wVar31].multiplier);
        uVar12 = Rand_div(4);
      } while ((uVar12 != 0) && (psVar5[wVar31].power < 0x69));
      goto switchD_001902c6_default;
    case 4:
    case 6:
      add_to_hit(paVar30,data->hit_increment * 2,L'\x00258ea0');
      goto switchD_001902c6_default;
    case 5:
    case 7:
      iVar13 = data->dam_increment;
      goto LAB_00190551;
    case 8:
    case 0x20:
      add_to_hit(paVar30,data->hit_increment * 2,L'\x00258ea0');
      iVar13 = data->dam_increment;
      wVar31 = extraout_EDX;
LAB_00190551:
      add_to_dam(paVar30,iVar13 * 2,wVar31);
      goto switchD_001902c6_default;
    case 0xb:
    case 0x11:
      wVar31 = L'\n';
      break;
    case 0xd:
      wVar31 = L'\x12';
      goto LAB_00190881;
    case 0x10:
    case 0x24:
    case 0x3d:
      wVar31 = L'\x0e';
      goto LAB_00190881;
    case 0x12:
    case 0x17:
    case 0x1d:
    case 0x21:
    case 0x27:
    case 0x29:
    case 0x2b:
    case 0x4e:
      iVar13 = data->ac_increment;
      if (paVar30->to_a < 0x25) {
        if (0x1a < paVar30->to_h) {
          uVar12 = 2;
          goto LAB_001902e4;
        }
      }
      else {
        uVar12 = 6;
LAB_001902e4:
        uVar12 = Rand_div(uVar12);
        if (uVar12 != 0) {
          uVar32 = (ulong)(uint)paVar30->to_a;
          pcVar18 = "Failed to add to-AC, value %d is too high\n";
          goto LAB_00190872;
        }
      }
      uVar12 = Rand_div(iVar13 * 2);
      uVar9 = (int)(short)((short)uVar12 + 1) + paVar30->to_a;
      uVar32 = (ulong)uVar9;
      paVar30->to_a = uVar9;
      pcVar18 = "Adding ability: AC bonus (new bonus is %+d)\n";
      goto LAB_00190872;
    case 0x13:
      uVar12 = Rand_div(2);
      uVar9 = (uVar12 + 1 & 0xff) + paVar30->dd;
      uVar32 = (ulong)uVar9;
      paVar30->dd = uVar9;
      pcVar18 = "Adding ability: extra damage dice (now %d dice)\n";
      goto LAB_00190872;
    case 0x14:
    case 0x16:
      uVar32 = (long)(paVar30->weight * 9) / 10;
      paVar30->weight = (int)uVar32;
      pcVar18 = "Adding ability: lower weight (new weight is %d)\n";
      uVar32 = uVar32 & 0xffffffff;
LAB_00190872:
      file_putf(log_file,pcVar18,uVar32);
      goto switchD_001902c6_default;
    case 0x15:
    case 0x4f:
      wVar31 = L'\b';
      break;
    case 0x18:
    case 0x3b:
      wVar31 = L'\v';
      goto LAB_00190881;
    case 0x19:
    case 0x2a:
    case 0x2c:
    case 0x34:
      wVar31 = L'\x05';
      break;
    case 0x1a:
    case 0x54:
      wVar31 = L'$';
      goto LAB_00190881;
    case 0x1b:
    case 0x37:
      wVar31 = L'\t';
      break;
    case 0x1c:
    case 0x53:
      wVar31 = L'\x0f';
      break;
    case 0x1e:
    case 0x39:
      wVar31 = L'\x0f';
      goto LAB_00190881;
    case 0x1f:
      wVar31 = L'\x03';
      break;
    case 0x22:
    case 0x46:
      wVar31 = L'\a';
      goto LAB_00190881;
    case 0x23:
    case 0x3e:
      wVar31 = L'\r';
      goto LAB_00190881;
    case 0x25:
      wVar31 = L'\x02';
      break;
    case 0x26:
      wVar31 = L'\x01';
      break;
    case 0x28:
    case 0x2f:
    case 0x41:
      lVar26 = 0;
      for (lVar20 = 0x24; lVar20 != 0x28; lVar20 = lVar20 + 1) {
        lVar26 = lVar26 + (ulong)(*(short *)(paVar30->flags + lVar20 * 4 + -0x48) < 1);
      }
      if (lVar26 != 0) {
        uVar12 = Rand_div((uint32_t)lVar26);
        lVar20 = 0;
        for (lStackY_3b0 = 0; lStackY_3b0 != 4; lStackY_3b0 = lStackY_3b0 + 1) {
          if (paVar30->el_info[lStackY_3b0].res_level < 1) {
            if (lVar20 == (int)uVar12) goto LAB_0019089a;
            lVar20 = lVar20 + 1;
          }
        }
      }
      goto switchD_001902c6_default;
    case 0x2d:
    case 0x3a:
      wVar31 = L'\x10';
      goto LAB_00190881;
    case 0x2e:
      wVar31 = L'\x04';
      break;
    case 0x30:
      add_resist(paVar30,L'\0');
      add_resist(paVar30,L'\x01');
      add_resist(paVar30,L'\x02');
      lStackY_3b0 = 3;
      goto LAB_0019089a;
    case 0x31:
      uVar12 = 0;
      for (lVar20 = 0; lVar20 != 0x1a; lVar20 = lVar20 + 2) {
        uVar12 = uVar12 + data->art_probs[*(short *)((long)art_idx_high_resist + lVar20)];
      }
      uVar9 = 0;
      _Var7 = false;
      do {
        if ((_Var7 != false) || (199 < uVar9)) goto switchD_001902c6_default;
        uVar14 = Rand_div(uVar12);
        uVar12 = data->art_probs[0x42];
        piVar29 = art_idx_high_resist;
        for (uVar32 = 0; ((int)uVar12 <= (int)uVar14 && (uVar32 < 0xd)); uVar32 = uVar32 + 1) {
          uVar12 = uVar12 + data->art_probs[*piVar29];
          piVar29 = piVar29 + 1;
        }
        switch(uVar32) {
        case 0:
          wVar31 = L'\x04';
          break;
        case 1:
          wVar31 = L'\x06';
          goto LAB_00190821;
        case 2:
          wVar31 = L'\x05';
          break;
        case 3:
          wVar31 = L'\x06';
          break;
        case 4:
          wVar31 = L'\a';
          goto LAB_00190821;
        case 5:
          wVar31 = L'\b';
          goto LAB_00190821;
        case 6:
          wVar31 = L'\a';
          break;
        case 7:
          wVar31 = L'\b';
          break;
        case 8:
          wVar31 = L'\t';
          break;
        case 9:
          wVar31 = L'\n';
          break;
        case 10:
          wVar31 = L'\v';
          break;
        case 0xb:
          wVar31 = L'\f';
          break;
        case 0xc:
          wVar31 = L'\t';
LAB_00190821:
          _Var7 = add_flag(paVar30,wVar31);
          goto LAB_00190843;
        default:
          _Var7 = false;
          goto LAB_00190843;
        }
        _Var7 = add_resist(paVar30,wVar31);
LAB_00190843:
        uVar9 = uVar9 + 1;
      } while( true );
    case 0x32:
      wVar31 = Rand_div(5);
      break;
    case 0x33:
      _Var7 = flags_test_all(flags1,5,1,2,3,4,5,0);
      while (_Var7 == false) {
        do {
          uVar12 = Rand_div(5);
        } while (4 < uVar12);
        _Var7 = add_flag(paVar30,uVar12 + L'\x01');
      }
      goto switchD_001902c6_default;
    case 0x35:
      wVar31 = L'\x06';
      break;
    case 0x36:
      wVar31 = L'\a';
      break;
    case 0x38:
      uVar12 = Rand_div(4);
      paVar30->el_info[(int)uVar12].res_level = 3;
      file_putf(log_file,"Adding immunity to %s\n",projections[(int)uVar12].name);
      goto switchD_001902c6_default;
    case 0x3c:
      if (paVar30->tval != 0x13) {
        paVar30->modifiers[0xd] = 1;
      }
      goto switchD_001902c6_default;
    case 0x3f:
      wVar31 = L'\n';
      goto LAB_00190881;
    case 0x40:
      wVar31 = L'\f';
      goto LAB_00190881;
    case 0x42:
      lStackY_3b0 = 4;
      goto LAB_0019089a;
    case 0x43:
      wVar31 = L'\x06';
      goto LAB_00190881;
    case 0x44:
      lStackY_3b0 = 5;
      goto LAB_0019089a;
    case 0x45:
      lStackY_3b0 = 6;
      goto LAB_0019089a;
    case 0x47:
      wVar31 = L'\b';
      goto LAB_00190881;
    case 0x48:
      lStackY_3b0 = 7;
      goto LAB_0019089a;
    case 0x49:
      lStackY_3b0 = 8;
      goto LAB_0019089a;
    case 0x4a:
      lStackY_3b0 = 9;
      goto LAB_0019089a;
    case 0x4b:
      lStackY_3b0 = 10;
      goto LAB_0019089a;
    case 0x4c:
      lStackY_3b0 = 0xb;
      goto LAB_0019089a;
    case 0x4d:
      lStackY_3b0 = 0xc;
LAB_0019089a:
      add_resist(paVar30,(wchar_t)lStackY_3b0);
      goto switchD_001902c6_default;
    case 0x50:
      if ((paVar30->activation == (activation *)0x0) && (poVar22->activation == (activation *)0x0))
      {
        iVar13 = data->max_power;
        iVar16 = 0;
        for (lVar20 = 0; (ulong)z_info->act_max * 0x38 - lVar20 != 0; lVar20 = lVar20 + 0x38) {
          iVar27 = *(int *)((long)&activations->power + lVar20);
          iVar28 = iVar16;
          if (iVar16 < iVar27) {
            iVar28 = iVar27;
          }
          if (iVar27 < 20000) {
            iVar16 = iVar28;
          }
        }
        iVar27 = 200;
        do {
          bVar34 = iVar27 == 0;
          iVar27 = iVar27 + -1;
          if (bVar34) goto switchD_001902c6_default;
          uVar12 = Rand_div((uint)z_info->act_max);
          wVar31 = activations[(int)uVar12].power;
        } while (((L'丟' < wVar31) ||
                 (iVar28 = (wVar31 * 100) / iVar16, iVar28 <= (int)(uVar3 * 0x32) / iVar13)) ||
                ((int)(uVar3 * 200) / iVar13 <= iVar28));
        file_putf(log_file,"Adding activation effect %d\n",(ulong)uVar12);
        paVar4 = activations;
        paVar30->activation = activations + (int)uVar12;
        paVar30->level = paVar4[(int)uVar12].level;
        (paVar30->time).base = wVar31 * 8;
        uVar9 = 1;
        if (L'\x05' < wVar31) {
          uVar9 = (uint)wVar31 / 5;
        }
        (paVar30->time).dice = uVar9;
        (paVar30->time).sides = wVar31;
      }
      goto switchD_001902c6_default;
    case 0x51:
      wVar31 = L'\t';
LAB_00190881:
      add_flag(paVar30,wVar31);
      goto switchD_001902c6_default;
    case 0x52:
      wVar31 = L'\x0e';
      break;
    case 0x55:
    case 0x56:
      if (300 < uVar3) {
        wVar31 = L'\x1a';
        goto LAB_00190881;
      }
    default:
      goto switchD_001902c6_default;
    }
    add_mod(paVar30,wVar31);
switchD_001902c6_default:
    remove_contradictory(paVar30);
    if ((paVar30->modifiers[2] != 0) && ((paVar30->tval & 0xfffffffeU) == 8)) {
      add_flag(paVar30,L'\x12');
    }
    remove_contradictory(paVar30);
    wVar31 = artifact_power(*aidx,"artifact attempt",verbose_00);
    if (wVar31 < L'\0') {
      wVar31 = -wVar31;
LAB_00190d0a:
      mem_free(a_dst->slays);
      mem_free(a_dst->brands);
      mem_free(a_dst->curses);
      mem_free(a_dst);
      wVar10 = poVar17->alloc_prob;
      if (wVar10 == L'\0') {
        wVar10 = L'\x14';
      }
      uVar9 = (uint)((long)(4000000 / (ulong)(uint)(wVar31 * wVar31)) / (long)wVar10);
      if (0x62 < (int)uVar9) {
        uVar9 = 99;
      }
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      paVar30->alloc_prob = uVar9;
      if (wVar31 < L'Ô') {
        iVar13 = (wVar31 * 3) / 5;
      }
      else {
        iVar13 = 0x7f;
      }
      paVar30->alloc_max = iVar13;
      iVar16 = (wVar31 * 100 + 10000) / data->max_power;
      iVar13 = 100;
      if (iVar16 < 100) {
        iVar13 = iVar16;
      }
      paVar30->alloc_min = iVar13;
      uVar14 = uVar3 / 0x14 + 5;
      uVar12 = Rand_div(uVar14);
      if (uVar12 == 0) {
        uVar12 = Rand_div(0x14);
        uVar32 = (ulong)(uint)paVar30->alloc_min;
        iVar16 = uVar12 + paVar30->alloc_prob + 1;
        iVar13 = 99;
        if (iVar16 < 99) {
          iVar13 = iVar16;
        }
        paVar30->alloc_prob = iVar13;
      }
      else {
        uVar12 = Rand_div(uVar14);
        uVar9 = paVar30->alloc_min;
        uVar32 = (ulong)uVar9;
        if (uVar12 == 0) {
          uVar3 = 1;
          if (1 < (int)uVar9) {
            uVar3 = (int)uVar9 / 2;
          }
          paVar30->alloc_min = uVar3;
          uVar32 = (ulong)uVar3;
        }
      }
      iVar13 = (int)uVar32;
      iVar16 = 0x7f;
      if (iVar13 < 0x40) {
        iVar16 = iVar13 * 2;
      }
      if (iVar16 < paVar30->alloc_max) {
        iVar16 = paVar30->alloc_max;
      }
      paVar30->alloc_max = iVar16;
      if (((paVar30->activation == (activation *)0x0) && (poVar17->activation == (activation *)0x0))
         && (poVar17->effect == (effect *)0x0)) {
        paVar30->level = iVar13;
      }
      file_putf(log_file,"New depths are min %d, max %d\n",uVar32);
      file_putf(log_file,"Power-based alloc_prob is %d\n",(ulong)(uint)paVar30->alloc_prob);
      file_putf(log_file,"<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
      file_putf(log_file,"Number of tries for artifact %d was: %d\n",(ulong)(uint)*aidx,iVar11);
      paVar30 = a_info;
      iVar11 = *aidx;
      pcVar18 = "Random ";
      piVar21 = local_328;
      for (lVar20 = 0x10; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)piVar21 = *(undefined8 *)pcVar18;
        pcVar18 = pcVar18 + ((ulong)bVar35 * -2 + 1) * 8;
        piVar21 = piVar21 + (ulong)bVar35 * -4 + 2;
      }
      pcVar18 = tval_find_name(a_info[iVar11].tval);
      my_strcat((char *)local_328,pcVar18,0x80);
      pcVar18 = format(" of power %d",(ulong)(uint)wVar31);
      my_strcat((char *)local_328,pcVar18,0x80);
      string_free(paVar30[iVar11].text);
      pcVar18 = string_make((char *)local_328);
      paVar30[iVar11].text = pcVar18;
      return;
    }
    if (bVar33) {
      uVar12 = Rand_div(2);
      file_putf(log_file,"Make it bad:\n");
      file_putf(log_file,"   ");
      uVar14 = Rand_div(7);
      if (uVar14 == 0) {
        flag_on_dbg(flags1,5,0x1a,"art->flags","OF_AGGRAVATE");
        file_putf(log_file," aggravate,");
      }
      uVar14 = Rand_div(4);
      if (uVar14 == 0) {
        flag_on_dbg(flags1,5,0x1b,"art->flags","OF_DRAIN_EXP");
        file_putf(log_file," drain xp,");
      }
      uVar14 = Rand_div(7);
      if (uVar14 == 0) {
        flag_on_dbg(flags1,5,0x19,"art->flags","OF_NO_TELEPORT");
        file_putf(log_file," no tele,");
      }
      uVar32 = 0;
      uVar9 = 0;
      for (lVar20 = 0x14; lVar20 != 0x24; lVar20 = lVar20 + 1) {
        if (0 < *(int *)(paVar30->flags + lVar20 * 4 + -0x48)) {
          uVar32 = (ulong)((int)uVar32 + 1);
          uVar14 = Rand_div(2);
          if ((lVar20 != 0x20) && (uVar14 == 0)) {
            *(int *)(paVar30->flags + lVar20 * 4 + -0x48) =
                 -*(int *)(paVar30->flags + lVar20 * 4 + -0x48);
            uVar9 = uVar9 + 1;
          }
        }
      }
      file_putf(log_file," flip %d of %d modifiers,",(ulong)uVar9,uVar32);
      if ((0 < paVar30->to_a) && (uVar14 = Rand_div(2), uVar14 == 0)) {
        paVar30->to_a = -paVar30->to_a;
        file_putf(log_file," flip ac,");
      }
      if ((0 < paVar30->to_h) && (uVar14 = Rand_div(2), uVar14 == 0)) {
        paVar30->to_h = -paVar30->to_h;
        file_putf(log_file," flip to-hit,");
      }
      if ((0 < paVar30->to_d) && (uVar14 = Rand_div(4), uVar14 == 0)) {
        paVar30->to_d = -paVar30->to_d;
        file_putf(log_file," flip to-dam,");
      }
      local_384 = 0;
      uVar9 = uVar12 + 1;
LAB_00190af6:
      bVar33 = uVar9 != 0;
      uVar9 = uVar9 - 1;
      if (bVar33) {
        _Var7 = flag_has_dbg(flags1,5,0x12,"art->flags","OF_BLESSED");
        if (!_Var7) {
          iVar13 = -6;
          do {
            iVar13 = iVar13 + 1;
            if (iVar13 == 0) goto LAB_00190af6;
            uVar14 = Rand_div(z_info->curse_max - 1);
            uVar15 = Rand_div(9);
            iVar8 = m_bonus(9,local_35c);
          } while (curses[uVar14 + L'\x01'].poss[paVar30->tval] != true);
          _Var7 = append_artifact_curse(paVar30,uVar14 + L'\x01',iVar8 * 10 + uVar15 + L'\x01');
          local_384 = local_384 + _Var7;
        }
        goto LAB_00190af6;
      }
      file_putf(log_file," %d of %d curses applied\n",(ulong)local_384,(ulong)(uVar12 + 1));
      uVar12 = Rand_div(3);
      bVar33 = uVar12 != 0;
    }
    else {
      bVar33 = false;
    }
    if (wVar10 < wVar31) {
      copy_artifact(a_dst,paVar30);
      file_putf(log_file,"--- Too powerful!  Rolling back.\n");
    }
    else if ((int)((uVar3 * 0x13) / 0x14) <= wVar31) goto LAB_00190d0a;
    iVar11 = iVar11 + 1;
  } while( true );
code_r0x0018f877:
  uVar12 = Rand_div((kb_info[tv].num_svals - wVar31) + 1);
  poVar17 = lookup_kind(tv,uVar12 + wVar31);
  pcVar18 = strstr(poVar17->name,"Ring of");
  if ((pcVar18 != (char *)0x0) ||
     (_Var7 = flag_has_dbg(poVar17->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART"), _Var7))
  goto LAB_0018f870;
  goto LAB_0018f872;
}

Assistant:

static void design_artifact(struct artifact_set_data *data, int tv, int *aidx)
{
	struct artifact *art = &a_info[*aidx];
	struct object_kind *kind = lookup_kind(art->tval, art->sval);
	int art_freq[ART_IDX_TOTAL];
	int art_level = art->level;
	int tries;
	int alloc_new;
	int ap = 0;
	bool hurt_me = false;

	/* Set tval if necessary */
	int tval = (tv == TV_NULL) ? get_base_item_tval(data) : tv;

	/* Structure to hold the old artifact */
	struct artifact *a_old = mem_zalloc(sizeof *a_old);

	/* Choose a power for the artifact */
	int power = Rand_sample(data->avg_tv_power[tval],
							data->max_tv_power[tval],
							data->min_tv_power[tval],
							20, 20);

	/* Choose a name */
	char *new_name = artifact_gen_name(art, name_sections);

	/* Skip fixed artifacts */
	while (strstr(art->name, "The One Ring") ||
		kf_has(kind->kind_flags, KF_QUEST_ART)) {
		(*aidx)++;
		if ((*aidx) >= z_info->a_max) {
			string_free(new_name);
			mem_free(a_old);
			return;
		}
		art = &a_info[*aidx];
		art_level = art->level;
	}

	/* Apply the new name */
	string_free(art->name);
	art->name = new_name;

	file_putf(log_file, ">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
	file_putf(log_file, "Artifact %d: power = %d\n", *aidx, power);

	/* Flip the sign on power if it's negative (unlikely) and damage */
	if (power < 0) {
		hurt_me = true;
		power = -power;
	}

	/* Choose a base item typen not too powerful, so we'll have to add to it. */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		int base_power = 0;

		/* Get the new item kind and do basic prep on it */
		if (tval == TV_NULL) {
			tval = get_base_item_tval(data);
		}
		kind = get_base_item(data, tval);
		artifact_prep(art, kind, data);

		/* Get the kind again in case it's changed */
		kind = lookup_kind(art->tval, art->sval);

		base_power = artifact_power(*aidx, "for base item power", true);
		file_putf(log_file, "Base item power %d\n", base_power);

		/* New base item power too close to target artifact power */
		if ((base_power > (power * 6) / 10 + 1) && (power - base_power < 20)) {
			file_putf(log_file, "Power too high!\n");
			continue;
		}

		/* Acceptable */
		break;
	};

	/* Failed to get a good base item */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning! Couldn't get appropriate power level on base item.\n");

	/* Generate the cumulative frequency table for this base item type */
	build_freq_table(art, art_freq, data);

	/* Copy artifact info temporarily. */
	copy_artifact(art, a_old);

	/* Give this artifact a shot at being supercharged */
	try_supercharge(art, power, data);
	ap = artifact_power(*aidx, "result of supercharge", true);
	if (ap > (power * 23) / 20 + 1)	{
		/* Too powerful -- put it back */
		copy_artifact(a_old, art);
		file_putf(log_file, "--- Supercharge is too powerful! Rolling back.\n");
	}

	/* Give this artifact a chance to be cursed - note it retains its power */
	if (one_in_(z_info->a_max / MAX(2, data->neg_power_total))) {
		hurt_me = true;
	}

	/* Do the actual artifact design */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		/* Copy artifact info temporarily. */
		copy_artifact(art, a_old);

		/* Add an ability */
		add_ability(art, power, art_freq, data);
		remove_contradictory(art);

		/* Check the power, handle negative power */
		ap = artifact_power(*aidx, "artifact attempt", true);
		if (ap < 0) {
			ap = -ap;
			break;
		}

		/* Curse the designated artifacts */
		if (hurt_me) {
			make_bad(art, art_level);
			if (one_in_(3)) {
				hurt_me = false;
			}
		}

		/* Check power */
		if (ap > (power * 23) / 20 + 1) {
			/* Too powerful -- put it back */
			copy_artifact(a_old, art);
			file_putf(log_file, "--- Too powerful!  Rolling back.\n");
			continue;
		} else if (ap >= (power * 19) / 20) {
			/* Just right */
			break;
		}
	}

	/* Couldn't generate an artifact with the number of permitted iterations */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning!  Couldn't get appropriate power level on artifact.\n");

	/* Cleanup a_old */
	mem_free(a_old->slays);
	mem_free(a_old->brands);
	mem_free(a_old->curses);
	mem_free(a_old);

	/* Set rarity based on power */
	alloc_new = 4000000 / (ap * ap);
	alloc_new /= (kind->alloc_prob ? kind->alloc_prob : 20);
	if (alloc_new > 99) alloc_new = 99;
	if (alloc_new < 1) alloc_new = 1;
	art->alloc_prob = alloc_new;


	/* Set depth according to power */
	art->alloc_max = MIN(127, (ap * 3) / 5);
	art->alloc_min = MIN(100, ((ap + 100) * 100 / data->max_power));

	/* Have a chance to be less rare or deep, more likely the less power */
	if (one_in_(5 + (power / 20))) {
		art->alloc_prob += randint1(20);
		if (art->alloc_prob > 99) art->alloc_prob = 99;
	} else if (one_in_(5 + (power / 20))) {
		art->alloc_min /= 2;
		if (art->alloc_min < 1) art->alloc_min = 1;
	}

	/* Sanity check */
	art->alloc_max = MAX(art->alloc_max, MIN(art->alloc_min * 2, 127));

	/*
	 * If there is no activation or effect from the kind, level currently
	 * does nothing.  Set it to alloc_min in case changes elsewhere start
	 * using level for the artifact.
	 */
	if (!art->activation && !kind->activation && !kind->effect) {
		art->level = art->alloc_min;
	}

	file_putf(log_file, "New depths are min %d, max %d\n", art->alloc_min,
			  art->alloc_max);
	file_putf(log_file, "Power-based alloc_prob is %d\n", art->alloc_prob);

	/* Success */
	file_putf(log_file, "<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
	file_putf(log_file, "Number of tries for artifact %d was: %d\n", *aidx,
			  tries);

	/* Describe it */
	describe_artifact(*aidx, ap);
}